

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.h
# Opt level: O2

void __thiscall shift_window_transformer::Linear<float>::~Linear(Linear<float> *this)

{
  _Vector_base<float,_std::allocator<float>_> *p_Var1;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0010b9f0;
  p_Var1 = &this->weights->super__Vector_base<float,_std::allocator<float>_>;
  if (p_Var1 != (_Vector_base<float,_std::allocator<float>_> *)0x0) {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var1);
    operator_delete(p_Var1,0x18);
    this->weights = (vector<float,_std::allocator<float>_> *)0x0;
  }
  p_Var1 = &this->bias->super__Vector_base<float,_std::allocator<float>_>;
  if (p_Var1 != (_Vector_base<float,_std::allocator<float>_> *)0x0) {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var1);
    operator_delete(p_Var1,0x18);
    this->bias = (vector<float,_std::allocator<float>_> *)0x0;
  }
  return;
}

Assistant:

~Linear() {
            if (weights != nullptr) {
                delete weights;
                weights = nullptr;
            }
            if (bias != nullptr) {
                delete bias;
                bias = nullptr;
            }
        }